

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O3

u32 recalculate_min_match_len(deflate_freqs *freqs,u32 max_search_depth)

{
  u32 *puVar1;
  u32 uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  iVar4 = 0;
  iVar5 = 0;
  iVar6 = 0;
  iVar7 = 0;
  lVar3 = 0;
  do {
    puVar1 = freqs->litlen + lVar3;
    iVar4 = iVar4 + *puVar1;
    iVar5 = iVar5 + puVar1[1];
    iVar6 = iVar6 + puVar1[2];
    iVar7 = iVar7 + puVar1[3];
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x100);
  iVar6 = iVar6 + iVar4;
  iVar7 = iVar7 + iVar5;
  iVar4 = 0;
  iVar5 = 0;
  iVar8 = 0;
  iVar9 = 0;
  lVar3 = 0;
  do {
    puVar1 = freqs->litlen + lVar3;
    iVar4 = iVar4 + (uint)((int)((uint)(iVar6 + iVar7) >> 10 | 0x80000000) <
                          (int)(*puVar1 ^ 0x80000000));
    iVar5 = iVar5 + (uint)((int)((uint)(iVar6 + iVar7) >> 10 | 0x80000000) <
                          (int)(puVar1[1] ^ 0x80000000));
    iVar8 = iVar8 + (uint)((int)((uint)(iVar6 + iVar7) >> 10 | 0x80000000) <
                          (int)(puVar1[2] ^ 0x80000000));
    iVar9 = iVar9 + (uint)((int)((uint)(iVar6 + iVar7) >> 10 | 0x80000000) <
                          (int)(puVar1[3] ^ 0x80000000));
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x100);
  uVar2 = choose_min_match_len(iVar9 + iVar5 + iVar8 + iVar4,max_search_depth);
  return uVar2;
}

Assistant:

static u32
recalculate_min_match_len(const struct deflate_freqs *freqs,
			  u32 max_search_depth)
{
	u32 literal_freq = 0;
	u32 cutoff;
	u32 num_used_literals = 0;
	int i;

	for (i = 0; i < DEFLATE_NUM_LITERALS; i++)
		literal_freq += freqs->litlen[i];

	cutoff = literal_freq >> 10; /* Ignore literals used very rarely. */

	for (i = 0; i < DEFLATE_NUM_LITERALS; i++) {
		if (freqs->litlen[i] > cutoff)
			num_used_literals++;
	}
	return choose_min_match_len(num_used_literals, max_search_depth);
}